

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int Curl_removeHandleFromPipeline(Curl_easy *handle,curl_llist *pipeline)

{
  curl_llist_element *local_28;
  curl_llist_element *curr;
  curl_llist *pipeline_local;
  Curl_easy *handle_local;
  
  if (pipeline != (curl_llist *)0x0) {
    for (local_28 = pipeline->head; local_28 != (curl_llist_element *)0x0; local_28 = local_28->next
        ) {
      if ((Curl_easy *)local_28->ptr == handle) {
        Curl_llist_remove(pipeline,local_28,(void *)0x0);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int Curl_removeHandleFromPipeline(struct Curl_easy *handle,
                                  struct curl_llist *pipeline)
{
  if(pipeline) {
    struct curl_llist_element *curr;

    curr = pipeline->head;
    while(curr) {
      if(curr->ptr == handle) {
        Curl_llist_remove(pipeline, curr, NULL);
        return 1; /* we removed a handle */
      }
      curr = curr->next;
    }
  }

  return 0;
}